

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int io_file_write(lua_State *L,FILE *fp,int start)

{
  int iVar1;
  size_t sVar2;
  ulong __n;
  TValue *pTVar3;
  TValue *pTVar4;
  bool bVar5;
  
  pTVar3 = L->base + (uint)start;
  bVar5 = true;
  pTVar4 = pTVar3;
  do {
    if (L->top <= pTVar4) {
      if (bVar5) {
        pTVar4 = L->base;
        L->top = pTVar4 + 1;
        if (start == 0) {
          (pTVar4->field_2).field_0 =
               *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                ((ulong)(L->glref).ptr32 + 0x194);
          (pTVar4->field_2).it = 0xfffffff3;
        }
        return 1;
      }
      iVar1 = luaL_fileresult(L,0,(char *)0x0);
      return iVar1;
    }
    if ((pTVar4->field_2).it == 0xfffffffb) {
      if (bVar5) {
        __n = (ulong)*(uint *)((ulong)(pTVar4->u32).lo + 0xc);
        sVar2 = fwrite((void *)((ulong)(pTVar4->u32).lo + 0x10),1,__n,(FILE *)fp);
        bVar5 = sVar2 == __n;
      }
      else {
LAB_0013f661:
        bVar5 = false;
      }
    }
    else {
      if (0xfffefffe < (pTVar4->field_2).it) {
        lj_err_argt(L,(int)((ulong)((long)pTVar3 - (long)L->base) >> 3) + 1,4);
      }
      if (!bVar5) goto LAB_0013f661;
      iVar1 = fprintf((FILE *)fp,"%.14g",pTVar4->u64);
      bVar5 = 0 < iVar1;
    }
    pTVar4 = pTVar4 + 1;
    pTVar3 = pTVar3 + 1;
  } while( true );
}

Assistant:

static int io_file_write(lua_State *L, FILE *fp, int start)
{
  cTValue *tv;
  int status = 1;
  for (tv = L->base+start; tv < L->top; tv++) {
    if (tvisstr(tv)) {
      MSize len = strV(tv)->len;
      status = status && (fwrite(strVdata(tv), 1, len, fp) == len);
    } else if (tvisint(tv)) {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, intV(tv));
      size_t len = (size_t)(buf+LJ_STR_INTBUF-p);
      status = status && (fwrite(p, 1, len, fp) == len);
    } else if (tvisnum(tv)) {
      status = status && (fprintf(fp, LUA_NUMBER_FMT, numV(tv)) > 0);
    } else {
      lj_err_argt(L, (int)(tv - L->base) + 1, LUA_TSTRING);
    }
  }
  if (LJ_52 && status) {
    L->top = L->base+1;
    if (start == 0)
      setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_OUTPUT));
    return 1;
  }
  return luaL_fileresult(L, status, NULL);
}